

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkwrite.c
# Opt level: O1

int mbedtls_pk_write_key_der(mbedtls_pk_context *key,uchar *buf,size_t size)

{
  mbedtls_rsa_context *ctx;
  mbedtls_ecp_keypair *ec;
  bool bVar1;
  mbedtls_pk_type_t mVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  size_t sVar6;
  uchar *c;
  mbedtls_mpi T;
  uchar *local_48;
  mbedtls_mpi local_40;
  
  local_48 = buf + size;
  mVar2 = mbedtls_pk_get_type(key);
  if (mVar2 != MBEDTLS_PK_RSA) {
    mVar2 = mbedtls_pk_get_type(key);
    if (mVar2 != MBEDTLS_PK_ECKEY) {
      return -0x3980;
    }
    ec = (mbedtls_ecp_keypair *)key->pk_ctx;
    uVar5 = pk_write_ec_pubkey(&local_48,buf,ec);
    if ((int)uVar5 < 0) {
LAB_001231bb:
      sVar6 = 0;
LAB_001231be:
      bVar1 = false;
      uVar3 = uVar5;
    }
    else {
      if ((long)local_48 - (long)buf < 1) {
        uVar5 = 0xffffff94;
        goto LAB_001231bb;
      }
      local_48[-1] = '\0';
      uVar3 = uVar5 + 1;
      local_48 = local_48 + -1;
      uVar5 = mbedtls_asn1_write_len(&local_48,buf,(ulong)uVar3);
      if ((int)uVar5 < 0) goto LAB_001231bb;
      uVar4 = mbedtls_asn1_write_tag(&local_48,buf,'\x03');
      if (-1 < (int)uVar4) {
        sVar6 = (ulong)uVar3 + (ulong)uVar4 + (ulong)uVar5;
        uVar5 = mbedtls_asn1_write_len(&local_48,buf,sVar6);
        if ((int)uVar5 < 0) goto LAB_001231bb;
        uVar4 = mbedtls_asn1_write_tag(&local_48,buf,0xa1);
        if ((int)uVar4 < 0) goto LAB_001231cd;
        sVar6 = sVar6 + uVar4 + (ulong)uVar5;
        uVar5 = pk_write_ec_param(&local_48,buf,ec);
        if (-1 < (int)uVar5) {
          uVar3 = mbedtls_asn1_write_len(&local_48,buf,(ulong)uVar5);
          if (-1 < (int)uVar3) {
            uVar4 = mbedtls_asn1_write_tag(&local_48,buf,0xa0);
            if (-1 < (int)uVar4) {
              sVar6 = sVar6 + (ulong)uVar4 + (ulong)(uVar3 + uVar5);
              uVar5 = mbedtls_asn1_write_mpi(&local_48,buf,&ec->d);
              if (-1 < (int)uVar5) {
                sVar6 = sVar6 + uVar5;
                *local_48 = '\x04';
                uVar5 = mbedtls_asn1_write_int(&local_48,buf,1);
                if (-1 < (int)uVar5) {
                  sVar6 = sVar6 + uVar5;
                  uVar5 = mbedtls_asn1_write_len(&local_48,buf,sVar6);
                  if (-1 < (int)uVar5) {
                    sVar6 = sVar6 + uVar5;
                    uVar5 = mbedtls_asn1_write_tag(&local_48,buf,'0');
                    if (-1 < (int)uVar5) {
                      sVar6 = sVar6 + uVar5;
                      bVar1 = true;
                      uVar3 = uVar5;
                      goto LAB_001231c0;
                    }
                  }
                }
              }
              goto LAB_001231be;
            }
            goto LAB_001231d0;
          }
          bVar1 = false;
          goto LAB_001231c0;
        }
        goto LAB_001231be;
      }
LAB_001231cd:
      sVar6 = 0;
LAB_001231d0:
      bVar1 = false;
      uVar3 = uVar4;
    }
LAB_001231c0:
    uVar5 = (uint)sVar6;
    goto joined_r0x001231c2;
  }
  ctx = (mbedtls_rsa_context *)key->pk_ctx;
  mbedtls_mpi_init(&local_40);
  sVar6 = 0;
  uVar3 = mbedtls_rsa_export_crt(ctx,(mbedtls_mpi *)0x0,(mbedtls_mpi *)0x0,&local_40);
  if (uVar3 == 0) {
    uVar5 = mbedtls_asn1_write_mpi(&local_48,buf,&local_40);
    if ((int)uVar5 < 0) {
      sVar6 = 0;
      uVar3 = uVar5;
    }
    else {
      sVar6 = (size_t)uVar5;
      uVar3 = mbedtls_rsa_export_crt(ctx,(mbedtls_mpi *)0x0,&local_40,(mbedtls_mpi *)0x0);
      if ((uVar3 == 0) && (uVar3 = mbedtls_asn1_write_mpi(&local_48,buf,&local_40), -1 < (int)uVar3)
         ) {
        sVar6 = (size_t)(uVar3 + uVar5);
        uVar3 = mbedtls_rsa_export_crt(ctx,&local_40,(mbedtls_mpi *)0x0,(mbedtls_mpi *)0x0);
        if ((uVar3 == 0) &&
           (uVar3 = mbedtls_asn1_write_mpi(&local_48,buf,&local_40), -1 < (int)uVar3)) {
          sVar6 = uVar3 + sVar6;
          uVar3 = mbedtls_rsa_export(ctx,(mbedtls_mpi *)0x0,(mbedtls_mpi *)0x0,&local_40,
                                     (mbedtls_mpi *)0x0,(mbedtls_mpi *)0x0);
          if (uVar3 == 0) {
            uVar3 = mbedtls_asn1_write_mpi(&local_48,buf,&local_40);
            if (-1 < (int)uVar3) {
              sVar6 = sVar6 + uVar3;
              uVar3 = mbedtls_rsa_export(ctx,(mbedtls_mpi *)0x0,&local_40,(mbedtls_mpi *)0x0,
                                         (mbedtls_mpi *)0x0,(mbedtls_mpi *)0x0);
              if (uVar3 == 0) {
                uVar3 = mbedtls_asn1_write_mpi(&local_48,buf,&local_40);
                if (-1 < (int)uVar3) {
                  sVar6 = sVar6 + uVar3;
                  uVar3 = mbedtls_rsa_export(ctx,(mbedtls_mpi *)0x0,(mbedtls_mpi *)0x0,
                                             (mbedtls_mpi *)0x0,&local_40,(mbedtls_mpi *)0x0);
                  if (uVar3 == 0) {
                    uVar3 = mbedtls_asn1_write_mpi(&local_48,buf,&local_40);
                    if (-1 < (int)uVar3) {
                      sVar6 = sVar6 + uVar3;
                      uVar3 = mbedtls_rsa_export(ctx,(mbedtls_mpi *)0x0,(mbedtls_mpi *)0x0,
                                                 (mbedtls_mpi *)0x0,(mbedtls_mpi *)0x0,&local_40);
                      if (uVar3 == 0) {
                        uVar3 = mbedtls_asn1_write_mpi(&local_48,buf,&local_40);
                        if (-1 < (int)uVar3) {
                          sVar6 = sVar6 + uVar3;
                          uVar3 = mbedtls_rsa_export(ctx,&local_40,(mbedtls_mpi *)0x0,
                                                     (mbedtls_mpi *)0x0,(mbedtls_mpi *)0x0,
                                                     (mbedtls_mpi *)0x0);
                          if (uVar3 == 0) {
                            uVar3 = mbedtls_asn1_write_mpi(&local_48,buf,&local_40);
                            if (-1 < (int)uVar3) {
                              sVar6 = sVar6 + uVar3;
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  mbedtls_mpi_free(&local_40);
  if ((int)uVar3 < 0) {
LAB_001230dd:
    bVar1 = false;
  }
  else {
    bVar1 = false;
    uVar3 = mbedtls_asn1_write_int(&local_48,buf,0);
    if (-1 < (int)uVar3) {
      sVar6 = sVar6 + uVar3;
      uVar3 = mbedtls_asn1_write_len(&local_48,buf,sVar6);
      if (-1 < (int)uVar3) {
        sVar6 = sVar6 + uVar3;
        uVar3 = mbedtls_asn1_write_tag(&local_48,buf,'0');
        if (-1 < (int)uVar3) {
          sVar6 = sVar6 + uVar3;
          bVar1 = true;
          goto LAB_001230e0;
        }
      }
      goto LAB_001230dd;
    }
  }
LAB_001230e0:
  uVar5 = (uint)sVar6;
joined_r0x001231c2:
  if (bVar1) {
    uVar3 = uVar5;
  }
  return uVar3;
}

Assistant:

int mbedtls_pk_write_key_der( mbedtls_pk_context *key, unsigned char *buf, size_t size )
{
    int ret;
    unsigned char *c = buf + size;
    size_t len = 0;

#if defined(MBEDTLS_RSA_C)
    if( mbedtls_pk_get_type( key ) == MBEDTLS_PK_RSA )
    {
        mbedtls_mpi T; /* Temporary holding the exported parameters */
        mbedtls_rsa_context *rsa = mbedtls_pk_rsa( *key );

        /*
         * Export the parameters one after another to avoid simultaneous copies.
         */

        mbedtls_mpi_init( &T );

        /* Export QP */
        if( ( ret = mbedtls_rsa_export_crt( rsa, NULL, NULL, &T ) ) != 0 ||
            ( ret = mbedtls_asn1_write_mpi( &c, buf, &T ) ) < 0 )
            goto end_of_export;
        len += ret;

        /* Export DQ */
        if( ( ret = mbedtls_rsa_export_crt( rsa, NULL, &T, NULL ) ) != 0 ||
            ( ret = mbedtls_asn1_write_mpi( &c, buf, &T ) ) < 0 )
            goto end_of_export;
        len += ret;

        /* Export DP */
        if( ( ret = mbedtls_rsa_export_crt( rsa, &T, NULL, NULL ) ) != 0 ||
            ( ret = mbedtls_asn1_write_mpi( &c, buf, &T ) ) < 0 )
            goto end_of_export;
        len += ret;

        /* Export Q */
        if ( ( ret = mbedtls_rsa_export( rsa, NULL, NULL,
                                         &T, NULL, NULL ) ) != 0 ||
             ( ret = mbedtls_asn1_write_mpi( &c, buf, &T ) ) < 0 )
            goto end_of_export;
        len += ret;

        /* Export P */
        if ( ( ret = mbedtls_rsa_export( rsa, NULL, &T,
                                         NULL, NULL, NULL ) ) != 0 ||
             ( ret = mbedtls_asn1_write_mpi( &c, buf, &T ) ) < 0 )
            goto end_of_export;
        len += ret;

        /* Export D */
        if ( ( ret = mbedtls_rsa_export( rsa, NULL, NULL,
                                         NULL, &T, NULL ) ) != 0 ||
             ( ret = mbedtls_asn1_write_mpi( &c, buf, &T ) ) < 0 )
            goto end_of_export;
        len += ret;

        /* Export E */
        if ( ( ret = mbedtls_rsa_export( rsa, NULL, NULL,
                                         NULL, NULL, &T ) ) != 0 ||
             ( ret = mbedtls_asn1_write_mpi( &c, buf, &T ) ) < 0 )
            goto end_of_export;
        len += ret;

        /* Export N */
        if ( ( ret = mbedtls_rsa_export( rsa, &T, NULL,
                                         NULL, NULL, NULL ) ) != 0 ||
             ( ret = mbedtls_asn1_write_mpi( &c, buf, &T ) ) < 0 )
            goto end_of_export;
        len += ret;

    end_of_export:

        mbedtls_mpi_free( &T );
        if( ret < 0 )
            return( ret );

        MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_int( &c, buf, 0 ) );
        MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_len( &c, buf, len ) );
        MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_tag( &c,
                                               buf, MBEDTLS_ASN1_CONSTRUCTED |
                                               MBEDTLS_ASN1_SEQUENCE ) );
    }
    else
#endif /* MBEDTLS_RSA_C */
#if defined(MBEDTLS_ECP_C)
    if( mbedtls_pk_get_type( key ) == MBEDTLS_PK_ECKEY )
    {
        mbedtls_ecp_keypair *ec = mbedtls_pk_ec( *key );
        size_t pub_len = 0, par_len = 0;

        /*
         * RFC 5915, or SEC1 Appendix C.4
         *
         * ECPrivateKey ::= SEQUENCE {
         *      version        INTEGER { ecPrivkeyVer1(1) } (ecPrivkeyVer1),
         *      privateKey     OCTET STRING,
         *      parameters [0] ECParameters {{ NamedCurve }} OPTIONAL,
         *      publicKey  [1] BIT STRING OPTIONAL
         *    }
         */

        /* publicKey */
        MBEDTLS_ASN1_CHK_ADD( pub_len, pk_write_ec_pubkey( &c, buf, ec ) );

        if( c - buf < 1 )
            return( MBEDTLS_ERR_ASN1_BUF_TOO_SMALL );
        *--c = 0;
        pub_len += 1;

        MBEDTLS_ASN1_CHK_ADD( pub_len, mbedtls_asn1_write_len( &c, buf, pub_len ) );
        MBEDTLS_ASN1_CHK_ADD( pub_len, mbedtls_asn1_write_tag( &c, buf, MBEDTLS_ASN1_BIT_STRING ) );

        MBEDTLS_ASN1_CHK_ADD( pub_len, mbedtls_asn1_write_len( &c, buf, pub_len ) );
        MBEDTLS_ASN1_CHK_ADD( pub_len, mbedtls_asn1_write_tag( &c, buf,
                            MBEDTLS_ASN1_CONTEXT_SPECIFIC | MBEDTLS_ASN1_CONSTRUCTED | 1 ) );
        len += pub_len;

        /* parameters */
        MBEDTLS_ASN1_CHK_ADD( par_len, pk_write_ec_param( &c, buf, ec ) );

        MBEDTLS_ASN1_CHK_ADD( par_len, mbedtls_asn1_write_len( &c, buf, par_len ) );
        MBEDTLS_ASN1_CHK_ADD( par_len, mbedtls_asn1_write_tag( &c, buf,
                            MBEDTLS_ASN1_CONTEXT_SPECIFIC | MBEDTLS_ASN1_CONSTRUCTED | 0 ) );
        len += par_len;

        /* privateKey: write as MPI then fix tag */
        MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_mpi( &c, buf, &ec->d ) );
        *c = MBEDTLS_ASN1_OCTET_STRING;

        /* version */
        MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_int( &c, buf, 1 ) );

        MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_len( &c, buf, len ) );
        MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_tag( &c, buf, MBEDTLS_ASN1_CONSTRUCTED |
                                                    MBEDTLS_ASN1_SEQUENCE ) );
    }
    else
#endif /* MBEDTLS_ECP_C */
        return( MBEDTLS_ERR_PK_FEATURE_UNAVAILABLE );

    return( (int) len );
}